

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackVariableBasicTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Variable *this;
  ResourceTestCase *this_00;
  long lVar1;
  SharedPtr variable;
  ProgramResourceQueryTestTarget local_38;
  
  for (lVar1 = 0; lVar1 != 0x15; lVar1 = lVar1 + 1) {
    if ((generateTransformFeedbackVariableBasicTypeCases::variableTypes[lVar1].important |
        !reducedSet) == 1) {
      this = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (this,parentStructure,
                 generateTransformFeedbackVariableBasicTypeCases::variableTypes[lVar1].type);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)this);
      this_00 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                (&local_38,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x800);
      ResourceTestCase::ResourceTestCase(this_00,context,&variable,&local_38,(char *)0x0);
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
    }
  }
  return;
}

Assistant:

static void generateTransformFeedbackVariableBasicTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	static const struct
	{
		glu::DataType	type;
		bool			important;
	} variableTypes[] =
	{
		{ glu::TYPE_FLOAT,			true	},
		{ glu::TYPE_INT,			true	},
		{ glu::TYPE_UINT,			true	},

		{ glu::TYPE_FLOAT_VEC2,		false	},
		{ glu::TYPE_FLOAT_VEC3,		true	},
		{ glu::TYPE_FLOAT_VEC4,		false	},

		{ glu::TYPE_INT_VEC2,		false	},
		{ glu::TYPE_INT_VEC3,		true	},
		{ glu::TYPE_INT_VEC4,		false	},

		{ glu::TYPE_UINT_VEC2,		true	},
		{ glu::TYPE_UINT_VEC3,		false	},
		{ glu::TYPE_UINT_VEC4,		false	},

		{ glu::TYPE_FLOAT_MAT2,		false	},
		{ glu::TYPE_FLOAT_MAT2X3,	false	},
		{ glu::TYPE_FLOAT_MAT2X4,	false	},
		{ glu::TYPE_FLOAT_MAT3X2,	false	},
		{ glu::TYPE_FLOAT_MAT3,		false	},
		{ glu::TYPE_FLOAT_MAT3X4,	true	},
		{ glu::TYPE_FLOAT_MAT4X2,	false	},
		{ glu::TYPE_FLOAT_MAT4X3,	false	},
		{ glu::TYPE_FLOAT_MAT4,		false	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (variableTypes[ndx].important || !reducedSet)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].type));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, PROGRAMRESOURCEPROP_TYPE)));
		}
	}
}